

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vectors.h
# Opt level: O2

void __thiscall
pica::FieldInterpolatorCIC<pica::YeeGrid<(pica::Dimension)1,_double>_>::get
          (FieldInterpolatorCIC<pica::YeeGrid<(pica::Dimension)1,_double>_> *this,
          PositionType position,Vector3<double> *e,Vector3<double> *b)

{
  GridType *pGVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar5 = position.x *
          (this->super_FieldInterpolatorYeeGridCICBase<(pica::Dimension)1,_double>).inverseStep.x;
  dVar7 = dVar5 - (this->super_FieldInterpolatorYeeGridCICBase<(pica::Dimension)1,_double>).
                  normalizedOrigin.x;
  dVar8 = dVar7 - (double)(int)dVar7;
  dVar5 = dVar5 - (this->super_FieldInterpolatorYeeGridCICBase<(pica::Dimension)1,_double>).
                  normalizedOriginStaggered.x;
  dVar6 = dVar5 - (double)(int)dVar5;
  pGVar1 = (this->super_FieldInterpolatorYeeGridCICBase<(pica::Dimension)1,_double>).grid;
  lVar3 = (long)(int)dVar7;
  lVar2 = *(long *)&(pGVar1->super_Grid<(pica::Dimension)1,_double>).exData.data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl;
  dVar7 = 1.0 - dVar8;
  e->x = *(double *)(lVar2 + lVar3 * 8) * dVar7 + *(double *)(lVar2 + 8 + lVar3 * 8) * dVar8;
  lVar4 = (long)(int)dVar5;
  lVar2 = (long)(pGVar1->super_Grid<(pica::Dimension)1,_double>).eyData.data.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
  dVar5 = 1.0 - dVar6;
  e->y = *(double *)(lVar2 + lVar4 * 8) * dVar5 + *(double *)(lVar2 + 8 + lVar4 * 8) * dVar6;
  lVar2 = (long)(pGVar1->super_Grid<(pica::Dimension)1,_double>).ezData.data.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
  e->z = *(double *)(lVar2 + lVar4 * 8) * dVar5 + *(double *)(lVar2 + 8 + lVar4 * 8) * dVar6;
  lVar2 = (long)(pGVar1->super_Grid<(pica::Dimension)1,_double>).bxData.data.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
  b->x = dVar5 * *(double *)(lVar2 + lVar4 * 8) + dVar6 * *(double *)(lVar2 + 8 + lVar4 * 8);
  lVar2 = (long)(pGVar1->super_Grid<(pica::Dimension)1,_double>).byData.data.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
  b->y = *(double *)(lVar2 + lVar3 * 8) * dVar7 + *(double *)(lVar2 + 8 + lVar3 * 8) * dVar8;
  lVar2 = (long)(pGVar1->super_Grid<(pica::Dimension)1,_double>).bzData.data.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
  b->z = dVar7 * *(double *)(lVar2 + lVar3 * 8) + dVar8 * *(double *)(lVar2 + 8 + lVar3 * 8);
  return;
}

Assistant:

inline const Vector1<T> operator * (const Vector1<T>& v1, const Vector1<T>& v2)
{
    return Vector1<T>(v1.x * v2.x);
}